

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticDescriptor.h
# Opt level: O1

void __thiscall psy::DiagnosticDescriptor::~DiagnosticDescriptor(DiagnosticDescriptor *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->description_)._M_dataplus._M_p;
  paVar2 = &(this->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->title_)._M_dataplus._M_p;
  paVar2 = &(this->title_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->id_)._M_dataplus._M_p;
  paVar2 = &(this->id_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class PSY_API DiagnosticDescriptor
{
public:
    DiagnosticDescriptor(std::string id,
                         std::string title,
                         std::string description,
                         DiagnosticSeverity defaultSeverity,
                         DiagnosticCategory category);

    /**
     * The Id of \c this DiagnosticDescriptor.
     */
    const std::string& id() const;

    /**
     * The title of \c this DiagnosticDescriptor.
     */
    const std::string& title() const;

    /**
     * The description of \c this DiagnosticDescriptor.
     */
    const std::string& description() const;

    /**
     * The default severity of \c this DiagnosticDescriptor.
     */
    DiagnosticSeverity defaultSeverity() const;

    /**
     * The category of \c this DiagnosticDescriptor.
     */
    DiagnosticCategory category() const;

private:
    std::string id_;
    std::string title_;
    std::string description_;
    DiagnosticSeverity defaultSeverity_;
    DiagnosticCategory category_;
}